

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O2

void __thiscall CTcMake::add_module_first(CTcMake *this,CTcMakeModule *mod)

{
  mod->nxt_ = this->mod_head_;
  this->mod_head_ = mod;
  if (this->mod_tail_ != (CTcMakeModule *)0x0) {
    return;
  }
  this->mod_tail_ = mod;
  return;
}

Assistant:

void CTcMake::add_module_first(CTcMakeModule *mod)
{
    /* add it at the end of our list */
    mod->set_next(mod_head_);
    mod_head_ = mod;

    /* if it's the first thing in the list, it's the tail as well */
    if (mod_tail_ == 0)
        mod_tail_ = mod;
}